

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatefootprint.cpp
# Opt level: O0

void __thiscall
ValidateFootprint::CheckProbability(ValidateFootprint *this,OASIS_FLOAT totalProbability)

{
  int probCheck;
  OASIS_FLOAT totalProbability_local;
  ValidateFootprint *this_local;
  
  if ((int)(totalProbability * 10000.0 + 0.5) != 10000) {
    fprintf(_stderr,
            "ERROR: Probabilities for event ID %d and areaperil ID %u do not sum to 1.0 (total probability = %f).\n"
            ,(double)totalProbability,(ulong)(uint)this->prevEventID_,(ulong)this->prevAreaPerilID_)
    ;
    Validate::PrintErrorMessage(&this->super_Validate);
  }
  return;
}

Assistant:

inline void ValidateFootprint::CheckProbability(const OASIS_FLOAT totalProbability) {
/* Check probabilities for each event ID-areaperil ID pair sum to 1.0. */

  // Define precision to avoid floating point errors
  int probCheck = (int)(totalProbability * 10000 + 0.5);
  if (probCheck != 10000) {

    fprintf(stderr, "ERROR: Probabilities for event ID %d and areaperil ID %u"
		    " do not sum to 1.0 (total probability = %f).\n",
	    prevEventID_, prevAreaPerilID_, totalProbability);
    PrintErrorMessage();

  }

}